

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O3

void __thiscall
OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::MultipoleAtypeParameters> *this,string *id,
          MultipoleAtypeParameters *data)

{
  bool bVar1;
  uint i_1;
  uint i;
  long lVar2;
  long lVar3;
  Mat3x3d *pMVar4;
  Mat3x3d *pMVar5;
  
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_00226510;
  bVar1 = data->isQuadrupole;
  (this->data_).isDipole = data->isDipole;
  (this->data_).isQuadrupole = bVar1;
  (this->data_).dipole.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->data_).dipole.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->data_).dipole.super_Vector<double,_3U>.data_[2] = 0.0;
  if (&this->data_ != data) {
    lVar2 = 0;
    do {
      (this->data_).dipole.super_Vector<double,_3U>.data_[lVar2] =
           (data->dipole).super_Vector<double,_3U>.data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    pMVar5 = &(this->data_).quadrupole;
    pMVar4 = &data->quadrupole;
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        (pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar3] =
             (pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
             [lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar2 = lVar2 + 1;
      pMVar5 = (Mat3x3d *)
               ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
      pMVar4 = (Mat3x3d *)
               ((pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar2 != 3);
  }
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}